

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O2

PolyKernel * __thiscall CoreML::Specification::Kernel::mutable_polykernel(Kernel *this)

{
  PolyKernel *this_00;
  
  if (this->_oneof_case_[0] == 3) {
    this_00 = (PolyKernel *)(this->kernel_).linearkernel_;
  }
  else {
    clear_kernel(this);
    this->_oneof_case_[0] = 3;
    this_00 = (PolyKernel *)operator_new(0x28);
    PolyKernel::PolyKernel(this_00);
    (this->kernel_).polykernel_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::PolyKernel* Kernel::mutable_polykernel() {
  if (!has_polykernel()) {
    clear_kernel();
    set_has_polykernel();
    kernel_.polykernel_ = new ::CoreML::Specification::PolyKernel;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Kernel.polyKernel)
  return kernel_.polykernel_;
}